

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStackWalker.cpp
# Opt level: O2

BOOL __thiscall
Js::JavascriptStackWalker::WalkToArgumentsFrame(JavascriptStackWalker *this,ArgumentsObject *args)

{
  BOOL BVar1;
  ArgumentsObject *pAVar2;
  
  do {
    BVar1 = Walk(this,true);
    if (BVar1 == 0) {
      return 0;
    }
  } while ((((*(ushort *)&this->field_0x50 & 4) == 0 & ((byte)*(ushort *)&this->field_0x50 ^ 1)) !=
            0) || (pAVar2 = (ArgumentsObject *)GetCurrentArgumentsObject(this), pAVar2 != args));
  return 1;
}

Assistant:

BOOL JavascriptStackWalker::WalkToArgumentsFrame(ArgumentsObject *args)
    {
        // Move the walker up the stack until we find the given arguments object on the frame.
        while (this->Walk(/*includeInlineFrame*/ true))
        {
            if (this->IsJavascriptFrame())
            {
                Var currArgs = this->GetCurrentArgumentsObject();
                if (currArgs == args)
                {
                    return TRUE;
                }
            }
        }
        return FALSE;
    }